

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_reserve(mcu8str *str,mcu8str_size_t nsize)

{
  mcu8str_size_t in_RSI;
  mcu8str *in_RDI;
  mcu8str newstr;
  char *local_28;
  uint uVar1;
  uint in_stack_ffffffffffffffe4;
  
  if ((ulong)in_RDI->buflen < in_RSI + 1) {
    mcu8str_create(in_RSI);
    memcpy(local_28,in_RDI->c_str,(ulong)(in_RDI->size + 1));
    uVar1 = in_RDI->size;
    mcu8str_swap(in_RDI,(mcu8str *)&local_28);
    mcu8str_dealloc((mcu8str *)CONCAT44(in_stack_ffffffffffffffe4,uVar1));
  }
  return;
}

Assistant:

void mcu8str_reserve( mcu8str* str, mcu8str_size_t nsize )
  {
    if ( nsize +1 <= str->buflen )
      return;//already has enough
    mcu8str newstr = mcu8str_create( nsize );
    //newstr.c_str can not overlap since it was just malloc'ed:
    STDNS memcpy( newstr.c_str, str->c_str, str->size + 1 );
    newstr.size = str->size;
    mcu8str_swap( str, &newstr );
    mcu8str_dealloc( &newstr );
  }